

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.hh
# Opt level: O0

void __thiscall
tchecker::ts::
lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
::lasso_path_t(lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
               *this,shared_ptr<tchecker::zg::zg_t> *ts)

{
  shared_ptr<tchecker::zg::zg_t> *ts_local;
  lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
  *this_local;
  
  tchecker::graph::
  lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>::
  lasso_path_t(&this->
                super_lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
              );
  (this->
  super_lasso_path_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>).
  super_multigraph_t<tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>.
  _vptr_multigraph_t = (_func_int **)&PTR__lasso_path_t_00487af0;
  std::shared_ptr<tchecker::zg::zg_t>::shared_ptr(&this->_ts,ts);
  return;
}

Assistant:

lasso_path_t(std::shared_ptr<TS> const & ts) : _ts(ts) {}